

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

cmInstallFilesGenerator *
CreateInstallFilesGenerator
          (cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles,cmInstallCommandArguments *args,bool programs)

{
  char *dest;
  char *file_permissions;
  char *component;
  char *rename;
  bool optional;
  MessageLevel message;
  cmInstallFilesGenerator *this;
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  
  message = cmInstallGenerator::SelectMessageLevel(mf,false);
  this = (cmInstallFilesGenerator *)operator_new(0x120);
  psVar1 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
  dest = (psVar1->_M_dataplus)._M_p;
  psVar1 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (psVar1->_M_dataplus)._M_p;
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  psVar1 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  component = (psVar1->_M_dataplus)._M_p;
  psVar1 = cmInstallCommandArguments::GetRename_abi_cxx11_(args);
  rename = (psVar1->_M_dataplus)._M_p;
  optional = cmInstallCommandArguments::GetOptional(args);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this,mf,absFiles,dest,programs,file_permissions,configurations,component,message,rename
             ,optional);
  return this;
}

Assistant:

static cmInstallFilesGenerator* CreateInstallFilesGenerator(
  cmMakefile* mf,
    const std::vector<std::string>& absFiles,
    const cmInstallCommandArguments& args, bool programs)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(mf);
  return new cmInstallFilesGenerator(mf,
                        absFiles, args.GetDestination().c_str(),
                        programs, args.GetPermissions().c_str(),
                        args.GetConfigurations(), args.GetComponent().c_str(),
                        message,
                        args.GetRename().c_str(), args.GetOptional());
}